

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O2

string * __thiscall
(anonymous_namespace)::DescriptorImpl::ToString_abi_cxx11_
          (string *__return_storage_ptr__,void *this,bool compat_format)

{
  undefined7 in_register_00000011;
  long in_FS_OFFSET;
  string ret;
  string local_30;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  local_30._M_string_length = 0;
  local_30.field_2._M_local_buf[0] = '\0';
  (**(code **)(*this + 0x98))
            (this,0,&local_30,(int)CONCAT71(in_register_00000011,compat_format) * 3,0);
  anon_unknown.dwarf_3e90a3a::AddChecksum(__return_storage_ptr__,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string ToString(bool compat_format) const final
    {
        std::string ret;
        ToStringHelper(nullptr, ret, compat_format ? StringType::COMPAT : StringType::PUBLIC);
        return AddChecksum(ret);
    }